

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_types_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  void *pvVar1;
  bool bVar2;
  uchar uVar3;
  uchar uVar4;
  unsigned_short uVar5;
  short sVar6;
  size_t sVar7;
  long lVar8;
  tm *ptVar9;
  uint uVar10;
  float *pfVar11;
  size_t sVar12;
  float fVar13;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<short> __l_05;
  initializer_list<ximu::Vector3<float>_> __l_06;
  initializer_list<ximu::Vector3<short>_> __l_07;
  initializer_list<unsigned_short> __l_08;
  undefined1 auStack_328 [8];
  tm l_tm;
  RegisterData r1;
  RegisterData r2;
  time_t tt;
  DateTimeData dtd2;
  vector<float,_std::allocator<float>_> qData;
  vector<float,_std::allocator<float>_> local_278;
  undefined1 local_260 [8];
  vector<float,_std::allocator<float>_> eulerAngles1;
  vector<float,_std::allocator<float>_> eulerAngles2;
  vector<float,_std::allocator<float>_> local_218;
  undefined1 local_200 [8];
  vector<float,_std::allocator<float>_> rotationMatrix;
  vector<float,_std::allocator<float>_> local_1d0;
  Quaternion<float> local_1b8;
  undefined1 local_1a8 [8];
  DateTimeData dtd1;
  float fStack_170;
  Vector3f gyro;
  Vector3f acce;
  Vector3f magn;
  vector<short,_std::allocator<short>_> sTestSet;
  vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_> vec3fTestSet;
  vector<unsigned_short,_std::allocator<unsigned_short>_> usTestSet;
  CalInertialAndMagneticData ciamd;
  vector<float,_std::allocator<float>_> fTestSet;
  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_> vec3sTestSet;
  undefined8 local_94;
  Vector3s gyro_r;
  short sStack_86;
  Vector3s acce_r;
  Vector3s local_7a;
  short sStack_74;
  Vector3s magn_r;
  float _batVolt0f;
  float _themp0f;
  short local_60;
  float _batVolt1f;
  undefined1 local_58 [4];
  float _themp1f;
  RawInertialAndMagneticData riamd;
  short _batVolt0s;
  short _themp0s;
  CalBatteryAndThermometerData cbatd;
  short local_30;
  DigitalIOData diod1;
  short _batVolt1s;
  short _themp1s;
  RawBatteryAndThermometerData rbatd;
  DigitalPortBits dpb1;
  DigitalPortBits dpb2;
  
  ximu::RegisterData::RegisterData((RegisterData *)&l_tm.tm_zone,ALGORITHM_TARE_QUAT_0,1.234);
  uVar5 = ximu::RegisterData::value((RegisterData *)&l_tm.tm_zone);
  if (uVar5 != 0x7fff) {
    return 1;
  }
  ximu::RegisterData::RegisterData(&r1,BATTERY_BIAS,0x94);
  fVar13 = ximu::RegisterData::floatValue(&r1);
  if (fVar13 != 0.578125) {
    return 1;
  }
  if (NAN(fVar13)) {
    return 1;
  }
  ximu::DateTimeData::DateTimeData((DateTimeData *)local_1a8);
  sVar7 = ximu::DateTimeData::year((DateTimeData *)local_1a8);
  if (sVar7 != 2000) {
    return 1;
  }
  sVar7 = ximu::DateTimeData::month((DateTimeData *)local_1a8);
  if (sVar7 != 1) {
    return 1;
  }
  sVar7 = ximu::DateTimeData::day((DateTimeData *)local_1a8);
  if (sVar7 != 1) {
    return 1;
  }
  sVar7 = ximu::DateTimeData::hours((DateTimeData *)local_1a8);
  if (sVar7 != 0) {
    return 1;
  }
  sVar7 = ximu::DateTimeData::minutes((DateTimeData *)local_1a8);
  if (sVar7 != 0) {
    return 1;
  }
  sVar7 = ximu::DateTimeData::seconds((DateTimeData *)local_1a8);
  if (sVar7 != 0) {
    return 1;
  }
  ximu::DateTimeData::year((DateTimeData *)local_1a8,0x7d1);
  ximu::DateTimeData::month((DateTimeData *)local_1a8,2);
  ximu::DateTimeData::day((DateTimeData *)local_1a8,3);
  ximu::DateTimeData::hours((DateTimeData *)local_1a8,4);
  ximu::DateTimeData::minutes((DateTimeData *)local_1a8,5);
  ximu::DateTimeData::seconds((DateTimeData *)local_1a8,6);
  sVar7 = ximu::DateTimeData::year((DateTimeData *)local_1a8);
  if (sVar7 != 0x7d1) {
    return 1;
  }
  sVar7 = ximu::DateTimeData::month((DateTimeData *)local_1a8);
  if (sVar7 != 2) {
    return 1;
  }
  sVar7 = ximu::DateTimeData::day((DateTimeData *)local_1a8);
  if (sVar7 != 3) {
    return 1;
  }
  sVar7 = ximu::DateTimeData::hours((DateTimeData *)local_1a8);
  if (sVar7 != 4) {
    return 1;
  }
  sVar7 = ximu::DateTimeData::minutes((DateTimeData *)local_1a8);
  if (sVar7 != 5) {
    return 1;
  }
  sVar7 = ximu::DateTimeData::seconds((DateTimeData *)local_1a8);
  if (sVar7 != 6) {
    return 1;
  }
  lVar8 = std::chrono::_V2::system_clock::now();
  r2 = (RegisterData)(lVar8 / 1000000000);
  ptVar9 = localtime((time_t *)&r2);
  auStack_328._0_4_ = ptVar9->tm_sec;
  auStack_328._4_4_ = ptVar9->tm_min;
  l_tm.tm_sec = ptVar9->tm_hour;
  l_tm.tm_min = ptVar9->tm_mday;
  l_tm.tm_hour = ptVar9->tm_mon;
  l_tm.tm_mday = ptVar9->tm_year;
  l_tm.tm_mon = ptVar9->tm_wday;
  l_tm.tm_year = ptVar9->tm_yday;
  l_tm.tm_wday = ptVar9->tm_isdst;
  l_tm.tm_yday = *(int *)&ptVar9->field_0x24;
  l_tm._32_8_ = ptVar9->tm_gmtoff;
  l_tm.tm_gmtoff = (long)ptVar9->tm_zone;
  ximu::DateTimeData::DateTimeData((DateTimeData *)&tt,(tm *)auStack_328);
  sVar12 = (size_t)l_tm.tm_mday;
  sVar7 = ximu::DateTimeData::year((DateTimeData *)&tt);
  if (sVar7 != sVar12) {
    return 1;
  }
  sVar12 = (size_t)l_tm.tm_hour;
  sVar7 = ximu::DateTimeData::month((DateTimeData *)&tt);
  if (sVar7 != sVar12) {
    return 1;
  }
  sVar12 = (size_t)l_tm.tm_min;
  sVar7 = ximu::DateTimeData::day((DateTimeData *)&tt);
  if (sVar7 != sVar12) {
    return 1;
  }
  sVar12 = (size_t)l_tm.tm_sec;
  sVar7 = ximu::DateTimeData::hours((DateTimeData *)&tt);
  if (sVar7 != sVar12) {
    return 1;
  }
  sVar12 = (size_t)(int)auStack_328._4_4_;
  sVar7 = ximu::DateTimeData::minutes((DateTimeData *)&tt);
  if (sVar7 != sVar12) {
    return 1;
  }
  sVar12 = (size_t)(int)auStack_328._0_4_;
  sVar7 = ximu::DateTimeData::seconds((DateTimeData *)&tt);
  if (sVar7 != sVar12) {
    return 1;
  }
  fTestSet.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x3f800000;
  __l._M_len = 4;
  __l._M_array = (iterator)
                 &fTestSet.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&dtd2._seconds,__l,
             (allocator_type *)
             ((long)&usTestSet.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  uVar10 = 1;
  if ((long)qData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start - dtd2._seconds == 0x10) {
    if (((((*(float *)dtd2._seconds != 1.0) || (NAN(*(float *)dtd2._seconds))) ||
         (*(float *)(dtd2._seconds + 4) != 0.0)) ||
        ((NAN(*(float *)(dtd2._seconds + 4)) || (*(float *)(dtd2._seconds + 8) != 0.0)))) ||
       ((NAN(*(float *)(dtd2._seconds + 8)) ||
        ((*(float *)(dtd2._seconds + 0xc) != 0.0 || (NAN(*(float *)(dtd2._seconds + 0xc))))))))
    goto LAB_001052ab;
    local_1b8._w = 0.18257418;
    local_1b8._x = 0.36514837;
    local_1b8._y = 0.5477225;
    local_1b8._z = 0.73029673;
    fTestSet.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x3ebaf4ba3e3af4ba;
    __l_00._M_len = 4;
    __l_00._M_array =
         (iterator)
         &fTestSet.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               &qData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,__l_00,
               (allocator_type *)
               ((long)&usTestSet.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    fTestSet.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x3ebae1483e3a5e35;
    __l_01._M_len = 4;
    __l_01._M_array =
         (iterator)
         &fTestSet.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage;
    std::vector<float,_std::allocator<float>_>::vector
              (&local_278,__l_01,
               (allocator_type *)
               ((long)&usTestSet.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    bVar2 = ximu::Utility::isWithinError<std::vector<float,std::allocator<float>>,float>
                      ((vector<float,_std::allocator<float>_> *)
                       &qData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&local_278,0.01);
    if (local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (qData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)0x0) {
      operator_delete(qData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    if (!bVar2) goto LAB_001052a6;
    fTestSet.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0xc23ca9fc429d6148;
    __l_02._M_len = 3;
    __l_02._M_array =
         (iterator)
         &fTestSet.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_260,__l_02,
               (allocator_type *)
               ((long)&usTestSet.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    ximu::Quaternion<float>::eulerAngles
              ((vector<float,_std::allocator<float>_> *)
               &eulerAngles1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_1b8);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               &eulerAngles2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<float,_std::allocator<float>_> *)local_260);
    std::vector<float,_std::allocator<float>_>::vector
              (&local_218,
               (vector<float,_std::allocator<float>_> *)
               &eulerAngles1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    bVar2 = ximu::Utility::isWithinError<std::vector<float,std::allocator<float>>,float>
                      ((vector<float,_std::allocator<float>_> *)
                       &eulerAngles2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,&local_218,0.001);
    if (local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (eulerAngles2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(eulerAngles2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    if (bVar2) {
      fTestSet.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x3f2a7efabf2a7efa;
      __l_03._M_len = 9;
      __l_03._M_array =
           (iterator)
           &fTestSet.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_200,__l_03,
                 (allocator_type *)
                 ((long)&usTestSet.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage + 4));
      ximu::Quaternion<float>::rotationMatrix
                ((vector<float,_std::allocator<float>_> *)
                 &rotationMatrix.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_1b8);
      std::vector<float,_std::allocator<float>_>::vector
                (&local_1d0,(vector<float,_std::allocator<float>_> *)local_200);
      bVar2 = ximu::Utility::isWithinError<std::vector<float,std::allocator<float>>,float>
                        ((vector<float,_std::allocator<float>_> *)
                         &rotationMatrix.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,&local_1d0,0.01);
      if (local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (rotationMatrix.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(rotationMatrix.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      }
      if (bVar2) {
        stack0xfffffffffffffe8c = 0x400000003f800000;
        gyro._x = 3.0;
        gyro._y = 4.0;
        gyro._z = 5.0;
        acce._x = 6.0;
        acce._y = 7.0;
        acce._z = 8.0;
        magn._x = 9.0;
        ximu::CalInertialAndMagneticData::CalInertialAndMagneticData
                  ((CalInertialAndMagneticData *)
                   ((long)&usTestSet.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                   (Vector3f *)((long)&dtd1._seconds + 4),(Vector3f *)&gyro._y,(Vector3f *)&acce._y)
        ;
        ximu::CalInertialAndMagneticData::gyroscope
                  ((CalInertialAndMagneticData *)
                   ((long)&usTestSet.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        if ((fTestSet.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._0_4_ == dtd1._seconds._4_4_) &&
           (!NAN(fTestSet.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._0_4_) && !NAN(dtd1._seconds._4_4_))) {
          ximu::CalInertialAndMagneticData::gyroscope
                    ((CalInertialAndMagneticData *)
                     ((long)&usTestSet.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          if ((ciamd._magnetometer._z == fStack_170) &&
             (!NAN(ciamd._magnetometer._z) && !NAN(fStack_170))) {
            ximu::CalInertialAndMagneticData::gyroscope
                      ((CalInertialAndMagneticData *)
                       ((long)&usTestSet.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
            if ((sTestSet.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_ == gyro._x) &&
               (!NAN(sTestSet.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_start._0_4_) && !NAN(gyro._x))) {
              ximu::CalInertialAndMagneticData::accelerometer
                        ((CalInertialAndMagneticData *)
                         ((long)&usTestSet.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
              if (((float)CONCAT22(sTestSet.super__Vector_base<short,_std::allocator<short>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._2_2_,
                                   (short)sTestSet.super__Vector_base<short,_std::allocator<short>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage) ==
                   gyro._y) &&
                 (!NAN((float)CONCAT22(sTestSet.super__Vector_base<short,_std::allocator<short>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._2_2_,
                                       (short)sTestSet.
                                              super__Vector_base<short,_std::allocator<short>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage)) &&
                  !NAN(gyro._y))) {
                ximu::CalInertialAndMagneticData::accelerometer
                          ((CalInertialAndMagneticData *)
                           ((long)&usTestSet.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
                if ((vec3fTestSet.
                     super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == gyro._z) &&
                   (!NAN(vec3fTestSet.
                         super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) && !NAN(gyro._z))
                   ) {
                  ximu::CalInertialAndMagneticData::accelerometer
                            ((CalInertialAndMagneticData *)
                             ((long)&usTestSet.
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
                  if (((float)riamd._gyroscope._0_4_ == acce._x) &&
                     (!NAN((float)riamd._gyroscope._0_4_) && !NAN(acce._x))) {
                    ximu::CalInertialAndMagneticData::magnetometer
                              ((CalInertialAndMagneticData *)
                               ((long)&usTestSet.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
                    if ((stack0xffffffffffffffc0 == acce._y) &&
                       (!NAN(stack0xffffffffffffffc0) && !NAN(acce._y))) {
                      ximu::CalInertialAndMagneticData::magnetometer
                                ((CalInertialAndMagneticData *)
                                 ((long)&usTestSet.
                                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
                      if ((local_94._4_4_ == acce._z) && (!NAN(local_94._4_4_) && !NAN(acce._z))) {
                        ximu::CalInertialAndMagneticData::magnetometer
                                  ((CalInertialAndMagneticData *)
                                   ((long)&usTestSet.
                                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
                        if (((float)acce_r._0_4_ == magn._x) &&
                           (!NAN((float)acce_r._0_4_) && !NAN(magn._x))) {
                          local_94._0_2_ = 1;
                          local_94._2_2_ = 2;
                          local_94._4_4_ = (float)CONCAT22(local_94._6_2_,3);
                          stack0xffffffffffffff78 = 0x50004;
                          local_7a._x = 7;
                          local_7a._y = 8;
                          local_7a._z = 9;
                          ximu::RawInertialAndMagneticData::RawInertialAndMagneticData
                                    ((RawInertialAndMagneticData *)local_58,(Vector3s *)&local_94,
                                     (Vector3s *)&gyro_r._z,&local_7a);
                          ximu::RawInertialAndMagneticData::gyroscope
                                    ((RawInertialAndMagneticData *)local_58);
                          if ((short)fTestSet.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage ==
                              (short)local_94) {
                            ximu::RawInertialAndMagneticData::gyroscope
                                      ((RawInertialAndMagneticData *)local_58);
                            if (ciamd._magnetometer._y._2_2_ == local_94._2_2_) {
                              ximu::RawInertialAndMagneticData::gyroscope
                                        ((RawInertialAndMagneticData *)local_58);
                              if (magn._z._0_2_ == local_94._4_2_) {
                                ximu::RawInertialAndMagneticData::accelerometer
                                          ((RawInertialAndMagneticData *)local_58);
                                if ((short)sTestSet.
                                           super__Vector_base<short,_std::allocator<short>_>._M_impl
                                           .super__Vector_impl_data._M_end_of_storage == gyro_r._z)
                                {
                                  ximu::RawInertialAndMagneticData::accelerometer
                                            ((RawInertialAndMagneticData *)local_58);
                                  if (vec3fTestSet.
                                      super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._2_2_ ==
                                      sStack_86) {
                                    ximu::RawInertialAndMagneticData::accelerometer
                                              ((RawInertialAndMagneticData *)local_58);
                                    if (_batVolt0s == 6) {
                                      ximu::RawInertialAndMagneticData::magnetometer
                                                ((RawInertialAndMagneticData *)local_58);
                                      if (sStack_74 == local_7a._x) {
                                        ximu::RawInertialAndMagneticData::magnetometer
                                                  ((RawInertialAndMagneticData *)local_58);
                                        if ((_batVolt0f._2_2_ == local_7a._y) &&
                                           (ximu::RawInertialAndMagneticData::magnetometer
                                                      ((RawInertialAndMagneticData *)local_58),
                                           local_60 == local_7a._z)) {
                                          ximu::DigitalPortBits::DigitalPortBits
                                                    ((DigitalPortBits *)&_batVolt1s,false,false,
                                                     false,false,false,false,false,false);
                                          ximu::DigitalPortBits::DigitalPortBits
                                                    ((DigitalPortBits *)((long)&_batVolt1s + 1),true
                                                     ,true,true,true,true,true,true,true);
                                          sVar7 = 0;
                                          do {
                                            bVar2 = ximu::DigitalPortBits::get
                                                              ((DigitalPortBits *)&_batVolt1s,sVar7)
                                            ;
                                            if ((bVar2) ||
                                               (bVar2 = ximu::DigitalPortBits::get
                                                                  ((DigitalPortBits *)
                                                                   ((long)&_batVolt1s + 1),sVar7),
                                               !bVar2)) goto LAB_00105263;
                                            sVar7 = sVar7 + 1;
                                          } while (sVar7 != 8);
                                          uVar3 = ximu::DigitalPortBits::byte
                                                            ((DigitalPortBits *)&_batVolt1s);
                                          if ((uVar3 == '\0') &&
                                             (uVar3 = ximu::DigitalPortBits::byte
                                                                ((DigitalPortBits *)
                                                                 ((long)&_batVolt1s + 1)),
                                             uVar3 == 0xff)) {
                                            ximu::DigitalPortBits::DigitalPortBits
                                                      ((DigitalPortBits *)
                                                       &fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                                  '\0');
                                            uVar3 = ximu::DigitalPortBits::byte
                                                              ((DigitalPortBits *)&_batVolt1s);
                                            uVar4 = ximu::DigitalPortBits::byte
                                                              ((DigitalPortBits *)
                                                               &fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                            ;
                                            if (uVar3 == uVar4) {
                                              ximu::DigitalPortBits::DigitalPortBits
                                                        ((DigitalPortBits *)&ciamd._magnetometer._y,
                                                         0xff);
                                              uVar3 = ximu::DigitalPortBits::byte
                                                                ((DigitalPortBits *)
                                                                 ((long)&_batVolt1s + 1));
                                              uVar4 = ximu::DigitalPortBits::byte
                                                                ((DigitalPortBits *)
                                                                 &ciamd._magnetometer._y);
                                              if (uVar3 == uVar4) {
                                                uVar3 = ximu::DigitalPortBits::byte
                                                                  ((DigitalPortBits *)&_batVolt1s);
                                                uVar4 = ximu::DigitalPortBits::byte
                                                                  ((DigitalPortBits *)
                                                                   ((long)&_batVolt1s + 1));
                                                if ((((((uVar3 != uVar4) &&
                                                       (bVar2 = ximu::DigitalPortBits::ax0
                                                                          ((DigitalPortBits *)
                                                                           &_batVolt1s), !bVar2)) &&
                                                      (bVar2 = ximu::DigitalPortBits::ax0
                                                                         ((DigitalPortBits *)
                                                                          ((long)&_batVolt1s + 1)),
                                                      bVar2)) &&
                                                     (((bVar2 = ximu::DigitalPortBits::ax1
                                                                          ((DigitalPortBits *)
                                                                           &_batVolt1s), !bVar2 &&
                                                       (bVar2 = ximu::DigitalPortBits::ax1
                                                                          ((DigitalPortBits *)
                                                                           ((long)&_batVolt1s + 1)),
                                                       bVar2)) &&
                                                      ((bVar2 = ximu::DigitalPortBits::ax2
                                                                          ((DigitalPortBits *)
                                                                           &_batVolt1s), !bVar2 &&
                                                       ((bVar2 = ximu::DigitalPortBits::ax2
                                                                           ((DigitalPortBits *)
                                                                            ((long)&_batVolt1s + 1))
                                                        , bVar2 &&
                                                        (bVar2 = ximu::DigitalPortBits::ax3
                                                                           ((DigitalPortBits *)
                                                                            &_batVolt1s), !bVar2))))
                                                      )))) && (bVar2 = ximu::DigitalPortBits::ax3
                                                                                 ((DigitalPortBits *
                                                                                  )((long)&
                                                  _batVolt1s + 1)), bVar2)) &&
                                                  ((((bVar2 = ximu::DigitalPortBits::ax4
                                                                        ((DigitalPortBits *)
                                                                         &_batVolt1s), !bVar2 &&
                                                     (bVar2 = ximu::DigitalPortBits::ax4
                                                                        ((DigitalPortBits *)
                                                                         ((long)&_batVolt1s + 1)),
                                                     bVar2)) &&
                                                    (bVar2 = ximu::DigitalPortBits::ax5
                                                                       ((DigitalPortBits *)
                                                                        &_batVolt1s), !bVar2)) &&
                                                   (((bVar2 = ximu::DigitalPortBits::ax5
                                                                        ((DigitalPortBits *)
                                                                         ((long)&_batVolt1s + 1)),
                                                     bVar2 && (bVar2 = ximu::DigitalPortBits::ax6
                                                                                 ((DigitalPortBits *
                                                                                  )&_batVolt1s),
                                                              !bVar2)) &&
                                                    ((bVar2 = ximu::DigitalPortBits::ax6
                                                                        ((DigitalPortBits *)
                                                                         ((long)&_batVolt1s + 1)),
                                                     bVar2 && ((bVar2 = ximu::DigitalPortBits::ax7
                                                                                  ((DigitalPortBits
                                                                                    *)&_batVolt1s),
                                                               !bVar2 && (bVar2 = ximu::
                                                  DigitalPortBits::ax7
                                                            ((DigitalPortBits *)
                                                             ((long)&_batVolt1s + 1)), bVar2))))))))
                                                  )) {
                                                  ximu::DigitalIOData::DigitalIOData
                                                            ((DigitalIOData *)&cbatd._thermometer,
                                                             (DigitalPortBits *)&_batVolt1s,
                                                             (DigitalPortBits *)
                                                             ((long)&_batVolt1s + 1));
                                                  ximu::DigitalIOData::direction
                                                            ((DigitalIOData *)
                                                             &fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  ;
                                                  uVar3 = ximu::DigitalPortBits::byte
                                                                    ((DigitalPortBits *)
                                                                     &fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  ;
                                                  uVar4 = ximu::DigitalPortBits::byte
                                                                    ((DigitalPortBits *)&_batVolt1s)
                                                  ;
                                                  uVar10 = 1;
                                                  if (uVar3 == uVar4) {
                                                    ximu::DigitalIOData::state
                                                              ((DigitalIOData *)
                                                               &fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  ;
                                                  uVar3 = ximu::DigitalPortBits::byte
                                                                    ((DigitalPortBits *)
                                                                     &fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  ;
                                                  uVar4 = ximu::DigitalPortBits::byte
                                                                    ((DigitalPortBits *)
                                                                     ((long)&_batVolt1s + 1));
                                                  if (uVar3 == uVar4) {
                                                    fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x7f7fffff00800000;
                                                  __l_04._M_len = 8;
                                                  __l_04._M_array =
                                                       (iterator)
                                                       &fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage;
                                                  std::vector<float,_std::allocator<float>_>::vector
                                                            ((vector<float,_std::allocator<float>_>
                                                              *)&ciamd._magnetometer._y,__l_04,
                                                             (allocator_type *)&magn._y);
                                                  pfVar11 = (float *)CONCAT44(ciamd._magnetometer._z
                                                                              ,CONCAT22(ciamd.
                                                  _magnetometer._y._2_2_,
                                                  ciamd._magnetometer._y._0_2_));
                                                  if (((((ABS(*pfVar11 - *pfVar11) < 1.1920929e-07)
                                                        && (ABS(pfVar11[1] - pfVar11[1]) <
                                                            1.1920929e-07)) &&
                                                       (ABS(pfVar11[2] - pfVar11[2]) < 1.1920929e-07
                                                       )) && ((ABS(pfVar11[3] - pfVar11[3]) <
                                                               1.1920929e-07 &&
                                                              (ABS(pfVar11[4] - pfVar11[4]) <
                                                               1.1920929e-07)))) &&
                                                     ((ABS(pfVar11[5] - pfVar11[5]) < 1.1920929e-07
                                                      && ((ABS(pfVar11[6] - pfVar11[6]) <
                                                           1.1920929e-07 &&
                                                          (ABS(pfVar11[7] - pfVar11[7]) <
                                                           1.1920929e-07)))))) {
                                                    fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0xfffe00027fff8000;
                                                  __l_05._M_len = 8;
                                                  __l_05._M_array =
                                                       (iterator)
                                                       &fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage;
                                                  std::vector<short,_std::allocator<short>_>::vector
                                                            ((vector<short,_std::allocator<short>_>
                                                              *)&magn._y,__l_05,
                                                             (allocator_type *)
                                                             &sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  ;
                                                  fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x800000;
                                                  __l_06._M_len = 4;
                                                  __l_06._M_array =
                                                       (iterator)
                                                       &fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage;
                                                  std::
                                                  vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ::vector((
                                                  vector<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  *)&sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                                  __l_06,(allocator_type *)
                                                         &vec3fTestSet.
                                                                                                                    
                                                  super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  pfVar11 = (float *)CONCAT44(sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _4_4_,CONCAT22(sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _2_2_,(short)sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  );
                                                  if ((1.1920929e-07 <= ABS(*pfVar11 - *pfVar11)) ||
                                                     ((1.1920929e-07 <= ABS(pfVar11[4] - pfVar11[4])
                                                      || (1.1920929e-07 <=
                                                          ABS(pfVar11[8] - pfVar11[8]))))) {
LAB_0010523c:
                                                    operator_delete(pfVar11);
                                                  }
                                                  else {
                                                    vec3fTestSet.
                                                                                                        
                                                  super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                       = (pointer)0x7fff000c00008000;
                                                  usTestSet.
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)0x35fff4;
                                                  usTestSet.
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish =
                                                       (pointer)0x2dffc8000c0000;
                                                  __l_07._M_len = 4;
                                                  __l_07._M_array =
                                                       (iterator)
                                                       &vec3fTestSet.
                                                                                                                
                                                  super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ;
                                                  std::
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  ::vector((
                                                  vector<ximu::Vector3<short>,_std::allocator<ximu::Vector3<short>_>_>
                                                  *)&fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                                  __l_07,(allocator_type *)&riamd._magnetometer._z);
                                                  stack0xffffffffffffffc0 = 0x6000400020000;
                                                  __l_08._M_len = 4;
                                                  __l_08._M_array =
                                                       (iterator)&riamd._magnetometer._z;
                                                  std::
                                                  vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ::vector((
                                                  vector<unsigned_short,_std::allocator<unsigned_short>_>
                                                  *)&vec3fTestSet.
                                                                                                          
                                                  super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,__l_08,(allocator_type *)&stack0xffffffffffffff8c
                                                  );
                                                  _sStack_74 = 0.32;
                                                  _batVolt0f = 37.5;
                                                  _themp0f = 2.999;
                                                  _batVolt1f = -11.5;
                                                  ximu::CalBatteryAndThermometerData::
                                                  CalBatteryAndThermometerData
                                                            ((CalBatteryAndThermometerData *)
                                                             &riamd._magnetometer._z,
                                                             (float *)&stack0xffffffffffffff8c,
                                                             &_batVolt0f);
                                                  ximu::CalBatteryAndThermometerData::batteryVoltage
                                                            ((CalBatteryAndThermometerData *)
                                                             &riamd._magnetometer._z);
                                                  fVar13 = ximu::CalBatteryAndThermometerData::
                                                           thermometer((CalBatteryAndThermometerData
                                                                        *)&riamd._magnetometer._z);
                                                  if (ABS(fVar13 - _batVolt0f) < 1.1920929e-07) {
                                                    ximu::CalBatteryAndThermometerData::
                                                    batteryVoltage((CalBatteryAndThermometerData *)
                                                                   &riamd._magnetometer._z,&_themp0f
                                                                  );
                                                    ximu::CalBatteryAndThermometerData::thermometer
                                                              ((CalBatteryAndThermometerData *)
                                                               &riamd._magnetometer._z,&_batVolt1f);
                                                    ximu::CalBatteryAndThermometerData::
                                                    batteryVoltage((CalBatteryAndThermometerData *)
                                                                   &riamd._magnetometer._z);
                                                    fVar13 = ximu::CalBatteryAndThermometerData::
                                                             thermometer((
                                                  CalBatteryAndThermometerData *)
                                                  &riamd._magnetometer._z);
                                                  if (ABS(fVar13 - _batVolt1f) < 1.1920929e-07) {
                                                    riamd._magnetometer._x = 0xb;
                                                    riamd._magnetometer._y = 0x15;
                                                    cbatd._thermometer._2_2_ = 5;
                                                    local_30 = -5;
                                                    ximu::RawBatteryAndThermometerData::
                                                    RawBatteryAndThermometerData
                                                              ((RawBatteryAndThermometerData *)
                                                               &stack0xffffffffffffffd2,
                                                               &riamd._magnetometer._x,
                                                               &riamd._magnetometer._y);
                                                    sVar6 = ximu::RawBatteryAndThermometerData::
                                                            batteryVoltage((
                                                  RawBatteryAndThermometerData *)
                                                  &stack0xffffffffffffffd2);
                                                  if ((sVar6 == riamd._magnetometer._x) &&
                                                     (sVar6 = ximu::RawBatteryAndThermometerData::
                                                              thermometer((
                                                  RawBatteryAndThermometerData *)
                                                  &stack0xffffffffffffffd2),
                                                  sVar6 == riamd._magnetometer._y)) {
                                                    ximu::RawBatteryAndThermometerData::
                                                    batteryVoltage((RawBatteryAndThermometerData *)
                                                                   &stack0xffffffffffffffd2,
                                                                   (short *)((long)&cbatd.
                                                  _thermometer + 2));
                                                  ximu::RawBatteryAndThermometerData::thermometer
                                                            ((RawBatteryAndThermometerData *)
                                                             &stack0xffffffffffffffd2,&local_30);
                                                  sVar6 = ximu::RawBatteryAndThermometerData::
                                                          batteryVoltage((
                                                  RawBatteryAndThermometerData *)
                                                  &stack0xffffffffffffffd2);
                                                  if (sVar6 == cbatd._thermometer._2_2_) {
                                                    sVar6 = ximu::RawBatteryAndThermometerData::
                                                            thermometer((
                                                  RawBatteryAndThermometerData *)
                                                  &stack0xffffffffffffffd2);
                                                  uVar10 = (uint)(sVar6 != local_30);
                                                  }
                                                  }
                                                  ximu::RawBatteryAndThermometerData::
                                                  ~RawBatteryAndThermometerData
                                                            ((RawBatteryAndThermometerData *)
                                                             &stack0xffffffffffffffd2);
                                                  }
                                                  }
                                                  ximu::CalBatteryAndThermometerData::
                                                  ~CalBatteryAndThermometerData
                                                            ((CalBatteryAndThermometerData *)
                                                             &riamd._magnetometer._z);
                                                  if (vec3fTestSet.
                                                                                                            
                                                  super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0) {
                                                    operator_delete(vec3fTestSet.
                                                                                                                                        
                                                  super__Vector_base<ximu::Vector3<float>,_std::allocator<ximu::Vector3<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  }
                                                  if (fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                                  != (pointer)0x0) {
                                                    operator_delete(fTestSet.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  ;
                                                  }
                                                  pfVar11 = (float *)CONCAT44(sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _4_4_,CONCAT22(sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                  _2_2_,(short)sTestSet.
                                                  super__Vector_base<short,_std::allocator<short>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                                                  );
                                                  if (pfVar11 != (float *)0x0) goto LAB_0010523c;
                                                  }
                                                  pvVar1 = (void *)CONCAT26(magn._z._2_2_,
                                                                            CONCAT24(magn._z._0_2_,
                                                                                     magn._y));
                                                  if (pvVar1 != (void *)0x0) {
                                                    operator_delete(pvVar1);
                                                  }
                                                  pfVar11 = (float *)CONCAT44(ciamd._magnetometer._z
                                                                              ,CONCAT22(ciamd.
                                                  _magnetometer._y._2_2_,
                                                  ciamd._magnetometer._y._0_2_));
                                                  if (pfVar11 == (float *)0x0) goto LAB_00105263;
                                                  }
                                                  operator_delete(pfVar11);
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
LAB_00105263:
                          ximu::RawInertialAndMagneticData::~RawInertialAndMagneticData
                                    ((RawInertialAndMagneticData *)local_58);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (local_200 != (undefined1  [8])0x0) {
        operator_delete((void *)local_200);
      }
    }
    if (eulerAngles1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(eulerAngles1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    if (local_260 != (undefined1  [8])0x0) {
      operator_delete((void *)local_260);
    }
  }
LAB_001052a6:
  if ((void *)dtd2._seconds == (void *)0x0) {
    return uVar10;
  }
LAB_001052ab:
  operator_delete((void *)dtd2._seconds);
  return uVar10;
}

Assistant:

int main(int argc, char* argv[]) {
	// all input and ouput values have been testing with the c# version

	////////////////////////////////////////////////////////
	//                 RegisterData                       //
	////////////////////////////////////////////////////////

	ximu::RegisterData r1(
		ximu::reg::RegisterAddresses::ALGORITHM_TARE_QUAT_0, 1.234f);
	if (r1.value() != 32767)
		return 1;

	ximu::RegisterData r2(ximu::reg::RegisterAddresses::BATTERY_BIAS,
		static_cast<unsigned short>(148));
	if (r2.floatValue() != 0.578125)
		return 1;

	/////////////////////////////////////////////////////////
	//                 DateTimeData                        //
	/////////////////////////////////////////////////////////

	ximu::DateTimeData dtd1;
	if (dtd1.year() != 2000 || dtd1.month() != 1 || dtd1.day() != 1 ||
		dtd1.hours() != 0 || dtd1.minutes() != 0 || dtd1.seconds() != 0)
		return 1;

	// test the setters
	dtd1.year(2001);
	dtd1.month(2);
	dtd1.day(3);
	dtd1.hours(4);
	dtd1.minutes(5);
	dtd1.seconds(6);


	if (dtd1.year() != 2001 || dtd1.month() != 2 || dtd1.day() != 3 ||
		dtd1.hours() != 4 || dtd1.minutes() != 5 || dtd1.seconds() != 6)
		return 1;

	// test with c/c++ time struct
	std::chrono::system_clock::time_point now = std::chrono::system_clock::now();
	std::time_t tt = std::chrono::system_clock::to_time_t(now);
	std::tm l_tm = *localtime(&tt);

	ximu::DateTimeData dtd2(l_tm);

	if (l_tm.tm_year != dtd2.year() || l_tm.tm_mon != dtd2.month() ||
		l_tm.tm_mday != dtd2.day() || l_tm.tm_hour != dtd2.hours() ||
		l_tm.tm_min != dtd2.minutes() || l_tm.tm_sec != dtd2.seconds()
		)
		return 1;

	//////////////////////////////////////////////
	//            Quaternion                    //
	//////////////////////////////////////////////

	// Constructors
	ximu::Quaternion<float> q1;
	ximu::Quaternion<float> q2(1, 0, 0, 0);
	ximu::QuaternionData q3;  // typedef as float as in c#

	std::vector<float> qData = { 1.0f, 0.0f, 0.0f, 0.0f };
	ximu::QuaternionData q4(qData.begin(), qData.end());

	if (q1 != q2 || q1 != q3 || q1 != q4)
		return 1;

	// normalize
	ximu::QuaternionData q5(1, 2, 3, 4);
	q5.normalize();

	ximu::QuaternionData q6(0.182, 0.365, 0.547, 0.732);

	// test if the values are quite similar.
	if (!ximu::Utility::isWithinError(q5.values(), q6.values(), 0.01f))
		return 1;

	// conjugate
	ximu::QuaternionData q7(1, 2, 3, 4);
	if (q7.conjugate() != ximu::QuaternionData(1, -2, -3, -4))
		return 1;

	// euler angles
	std::vector<float> eulerAngles1 = { 78.690f, -47.166f, 168.690f };
	std::vector<float> eulerAngles2 = q5.eulerAngles();

	if (!ximu::Utility::isWithinError(eulerAngles1, eulerAngles2, 0.001f))
		return 1;

	// rotation matrix
	std::vector<float> rotationMatrix = {
		-0.666f, 0.666f, 0.333f,
		0.133f, -0.333f, 0.933f,
		0.733f, 0.666f, 0.133f
	};

	float a = rotationMatrix[6];
	float b = rotationMatrix[7];
	float c = rotationMatrix[8];

	if (!ximu::Utility::isWithinError(q5.rotationMatrix(), rotationMatrix, 0.01f))
		return 1;

	//////////////////////////////////////////////
	//        CalInertialAndMagneticData        //
	//////////////////////////////////////////////
	ximu::Vector3f gyro(1.0f, 2.0f, 3.0f);
	ximu::Vector3f acce(4.0f, 5.0f, 6.0f);
	ximu::Vector3f magn(7.0f, 8.0f, 9.0f);
	ximu::CalInertialAndMagneticData ciamd(gyro, acce, magn);

	if (ciamd.gyroscope().x() != gyro.x() ||
		ciamd.gyroscope().y() != gyro.y() ||
		ciamd.gyroscope().z() != gyro.z() ||
		ciamd.accelerometer().x() != acce.x() ||
		ciamd.accelerometer().y() != acce.y() ||
		ciamd.accelerometer().z() != acce.z() ||
		ciamd.magnetometer().x() != magn.x() ||
		ciamd.magnetometer().y() != magn.y() ||
		ciamd.magnetometer().z() != magn.z()) {

		return 1;
	}


	//////////////////////////////////////////////
	////        RawInertialAndMagneticData      //
	//////////////////////////////////////////////
	
	ximu::Vector3s gyro_r(1.0f, 2.0f, 3.0f);
	ximu::Vector3s acce_r(4.0f, 5.0f, 6.0f);
	ximu::Vector3s magn_r(7.0f, 8.0f, 9.0f);
	ximu::RawInertialAndMagneticData riamd(gyro_r, acce_r, magn_r);

	if (riamd.gyroscope().x() != gyro_r.x() ||
		riamd.gyroscope().y() != gyro_r.y() ||
		riamd.gyroscope().z() != gyro_r.z() ||
		riamd.accelerometer().x() != acce_r.x() ||
		riamd.accelerometer().y() != acce_r.y() ||
		riamd.accelerometer().z() != acce_r.z() ||
		riamd.magnetometer().x() != magn_r.x() ||
		riamd.magnetometer().y() != magn_r.y() ||
		riamd.magnetometer().z() != magn_r.z()) {

		return 1;
	}
	

	/////////////////////////////////
	// 	Digital Port Bits	 //
	/////////////////////////////////
	ximu::DigitalPortBits dpb1(false, false, false, false, false, false, false, false);
	ximu::DigitalPortBits dpb2(true, true, true, true, true, true, true, true);

	for (size_t portIndex = 0; portIndex != 8; ++portIndex) {
		if (dpb1.get(portIndex))
			return 1;
		if (!dpb2.get(portIndex))
			return 1;
	}

	if (dpb1.byte() != 0 || dpb2.byte() != 255)
		return 1;
	if (dpb1 != ximu::DigitalPortBits(0) || dpb2 != ximu::DigitalPortBits(255) || dpb1 == dpb2)
		return 1;


	if (dpb1.ax0() || !dpb2.ax0())
		return 1;
	if (dpb1.ax1() || !dpb2.ax1())
		return 1;
	if (dpb1.ax2() || !dpb2.ax2())
		return 1;
	if (dpb1.ax3() || !dpb2.ax3())
		return 1;
	if (dpb1.ax4() || !dpb2.ax4())
		return 1;
	if (dpb1.ax5() || !dpb2.ax5())
		return 1;
	if (dpb1.ax6() || !dpb2.ax6())
		return 1;
	if (dpb1.ax7() || !dpb2.ax7())
		return 1;

	/////////////////////
	// Digital IO Data //
	/////////////////////
	ximu::DigitalIOData diod1(dpb1, dpb2);
	if (diod1.direction() != dpb1)
		return 1;
	if (diod1.state() != dpb2)
		return 1;


	//////////////////////////////////////////////
	//            CalAnalogueInputData          //
	//////////////////////////////////////////////


	std::vector<float> fTestSet = { std::numeric_limits<float>::min(),
		std::numeric_limits<float>::max(),
		0.0f, 12.0f, -500.12f,
		0.014f, -1020.1234f, 12.4f };

	ximu::CalAnalogueInputData carInTest(fTestSet[0], fTestSet[1], fTestSet[2], fTestSet[3],
		fTestSet[4], fTestSet[5], fTestSet[6], fTestSet[7]);

	if (!CompareFloates(carInTest.a(), fTestSet[0]) || !CompareFloates(carInTest.b(), fTestSet[1]) ||
		!CompareFloates(carInTest.c(), fTestSet[2]) || !CompareFloates(carInTest.d(), fTestSet[3]) ||
		!CompareFloates(carInTest.e(), fTestSet[4]) || !CompareFloates(carInTest.f(), fTestSet[5]) ||
		!CompareFloates(carInTest.g(), fTestSet[6]) || !CompareFloates(carInTest.h(), fTestSet[7]))
		return 1;

	std::vector<short> sTestSet = { std::numeric_limits<short>::min(),
		std::numeric_limits<short>::max(),
		2, -2, 4, 555, -640, 1024 };

	//////////////////////////////////////////////
	//            RawAnalogueInputData          //
	//////////////////////////////////////////////

	ximu::RawAnalogueInputData rawInTest(sTestSet[0], sTestSet[1], sTestSet[2], sTestSet[3],
		sTestSet[4], sTestSet[5], sTestSet[6], sTestSet[7]);

	if (rawInTest.a() != sTestSet[0] || rawInTest.b() != sTestSet[1] ||
		rawInTest.c() != sTestSet[2] || rawInTest.d() != sTestSet[3] ||
		rawInTest.e() != sTestSet[4] || rawInTest.f() != sTestSet[5] ||
		rawInTest.g() != sTestSet[6] || rawInTest.h() != sTestSet[7])
		return 1;


	//////////////////////////////////////////////
	//            CalAdxl345BusData             //
	//////////////////////////////////////////////

	std::vector<ximu::Vector3f> vec3fTestSet = { ximu::Vector3f(std::numeric_limits<float>::min(), 0.0f, 12.12f),
		ximu::Vector3f(std::numeric_limits<float>::max(), -12.12f, 53.85f),
		ximu::Vector3f(0.0f, 0.0f, 0.0f),
		ximu::Vector3f(12.12f, -56.12f, 45.89f) };

	ximu::CalAdxl345BusData calBusData(vec3fTestSet[0], vec3fTestSet[1], vec3fTestSet[2], vec3fTestSet[3]);

	if (!CompareFloates(calBusData.a().x(), vec3fTestSet[0].x()) ||
		!CompareFloates(calBusData.b().y(), vec3fTestSet[1].y()) ||
		!CompareFloates(calBusData.c().z(), vec3fTestSet[2].z()))
		return 1;

	//////////////////////////////////////////////
	//            RawAdxl345BusData             //
	//////////////////////////////////////////////


	std::vector<ximu::Vector3s> vec3sTestSet = { ximu::Vector3s(std::numeric_limits<short>::min(), 0, 12),
		ximu::Vector3s(std::numeric_limits<short>::max(), -12, 53),
		ximu::Vector3s(0, 0, 0),
		ximu::Vector3s(12, -56, 45) };

	ximu::RawAdxl345BusData rawBusData(vec3sTestSet[0], vec3sTestSet[1], vec3sTestSet[2], vec3sTestSet[3]);

	if (rawBusData.a().x() != vec3sTestSet[0].x() ||
		rawBusData.b().y() != vec3sTestSet[1].y() ||
		rawBusData.c().z() != vec3sTestSet[2].z())
		return 1;


	//////////////////////////////////////////////
	//            PWMOutputData                 //
	//////////////////////////////////////////////

	std::vector<unsigned short> usTestSet{ 0, 2, 4, 6 };
	ximu::PWMOutputData pwmOutputData(usTestSet[0], usTestSet[1], usTestSet[2], usTestSet[3]);

	// getters are inherited as protected methods

	//if (pwmOutputData.a() != usTestSet[0] ||
	// pwmOutputData.b() != usTestSet[1] ||
	// pwmOutputData.c() != usTestSet[2] ||
	// pwmOutputData.d() != usTestSet[3])
	// return 1;


	//////////////////////////////////////////////
	//       CalBatteryAndThermometerData       //
	//////////////////////////////////////////////

	float _batVolt0f = 0.32;
	float _themp0f = 37.5;
	float _batVolt1f = 2.999;
	float _themp1f = -11.5;

	ximu::CalBatteryAndThermometerData cbatd(_batVolt0f, _themp0f);

	if (!CompareFloates(cbatd.batteryVoltage(), _batVolt0f), !CompareFloates(cbatd.thermometer(), _themp0f))
		return 1;
	
	cbatd.batteryVoltage(_batVolt1f);
	cbatd.thermometer(_themp1f);

	if (!CompareFloates(cbatd.batteryVoltage(), _batVolt1f), !CompareFloates(cbatd.thermometer(), _themp1f))
		return 1;


	short _batVolt0s = 11;
	short _themp0s = 21;
	short _batVolt1s = 5;
	short _themp1s = -5;

	//////////////////////////////////////////////
	//       RawBatteryAndThermometerData       //
	//////////////////////////////////////////////

	ximu::RawBatteryAndThermometerData rbatd(_batVolt0s, _themp0s);

	if (rbatd.batteryVoltage() != _batVolt0s || rbatd.thermometer() != _themp0s)
		return 1;

	rbatd.batteryVoltage(_batVolt1s);
	rbatd.thermometer(_themp1s);

	if (rbatd.batteryVoltage() != _batVolt1s || rbatd.thermometer() != _themp1s)
		return 1;
		

	return 0;
}